

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor.cpp
# Opt level: O0

void __thiscall despot::Floor::AddCell(Floor *this,Coord coord)

{
  size_type sVar1;
  Floor *this_local;
  Coord coord_local;
  
  this_local = (Floor *)coord;
  sVar1 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::size(&this->cells_);
  this->floor_[this_local._4_4_][(int)this_local] = (int)sVar1;
  std::vector<despot::Coord,_std::allocator<despot::Coord>_>::push_back
            (&this->cells_,(value_type *)&this_local);
  return;
}

Assistant:

void Floor::AddCell(Coord coord) {
	floor_[coord.y][coord.x] = cells_.size();
	cells_.push_back(coord);
}